

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeH1.cpp
# Opt level: O0

void TPZShapeH1<pzshape::TPZShapePrism>::Shape(TPZVec<double> *pt,TPZShapeData *data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int64_t iVar5;
  double *pdVar6;
  TPZFMatrix<double> *pTVar7;
  long in_RSI;
  int xj_1;
  int i_1;
  int xj;
  int i;
  TPZFMatrix<double> *mult;
  TPZFNMatrix<1,_double> auxmat;
  int opt;
  REAL beta;
  REAL alpha;
  TPZManVector<double,_3> outvec;
  TPZFNMatrix<100,_double> dphiaux2;
  TPZFNMatrix<100,_double> dphiaux;
  TPZFNMatrix<100,_double> dphin;
  TPZFNMatrix<100,_double> phin;
  int sidedim;
  TPZTransform<double> *transform;
  int d_1;
  int numshape;
  int side;
  int shape;
  int d;
  int nod;
  TPZFNMatrix<63,_double> dphiblend;
  TPZFNMatrix<63,_double> phiblend;
  int NCorners;
  int NSides;
  int dim;
  _func_int **in_stack_ffffffffffffe918;
  TPZFMatrix<double> *in_stack_ffffffffffffe920;
  TPZFMatrix<double> *in_stack_ffffffffffffe928;
  double *in_stack_ffffffffffffe930;
  TPZVec<double> *in_stack_ffffffffffffe938;
  TPZFNMatrix<100,_double> *in_stack_ffffffffffffe940;
  TPZVec<double> *in_stack_ffffffffffffe948;
  TPZTransform<double> *in_stack_ffffffffffffe950;
  double *in_stack_ffffffffffffe958;
  TPZFNMatrix<1,_double> *in_stack_ffffffffffffe960;
  undefined4 in_stack_ffffffffffffea00;
  undefined4 in_stack_ffffffffffffea04;
  TPZFMatrix<double> *in_stack_ffffffffffffea08;
  undefined4 in_stack_ffffffffffffea10;
  undefined4 in_stack_ffffffffffffea14;
  int local_1568;
  int local_1564;
  int local_1560;
  int local_155c;
  undefined1 local_1548 [164];
  undefined4 local_14a4;
  undefined8 local_14a0;
  undefined8 local_1498;
  TPZFMatrix<double> *in_stack_ffffffffffffedd0;
  TPZFMatrix<double> *in_stack_ffffffffffffedd8;
  TPZVec<double> *in_stack_ffffffffffffede0;
  undefined1 local_10a0 [952];
  undefined1 local_ce8 [1908];
  int local_574;
  TPZTransform<double> *local_570;
  int local_564;
  int local_560;
  int local_55c;
  int local_558;
  int local_554;
  int local_550;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  long local_10;
  
  local_10 = in_RSI;
  pzshape::TPZShapePrism::ShapeCorner
            ((TPZVec<double> *)CONCAT44(in_stack_ffffffffffffea14,in_stack_ffffffffffffea10),
             in_stack_ffffffffffffea08,
             (TPZFMatrix<double> *)CONCAT44(in_stack_ffffffffffffea04,in_stack_ffffffffffffea00));
  iVar5 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(local_10 + 0x22a0));
  if (iVar5 != 6) {
    local_14 = 3;
    local_18 = 0x15;
    local_1c = 6;
    TPZFNMatrix<63,_double>::TPZFNMatrix
              ((TPZFNMatrix<63,_double> *)in_stack_ffffffffffffe940,
               (int64_t)in_stack_ffffffffffffe938,(int64_t)in_stack_ffffffffffffe930);
    TPZFNMatrix<63,_double>::TPZFNMatrix
              ((TPZFNMatrix<63,_double> *)in_stack_ffffffffffffe940,
               (int64_t)in_stack_ffffffffffffe938,(int64_t)in_stack_ffffffffffffe930);
    for (local_550 = 0; local_550 < 6; local_550 = local_550 + 1) {
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffe940->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffe938,(int64_t)in_stack_ffffffffffffe930);
      dVar1 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffe940->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffe938,(int64_t)in_stack_ffffffffffffe930);
      *pdVar6 = dVar1;
      for (local_554 = 0; local_554 < 3; local_554 = local_554 + 1) {
        pdVar6 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe940->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe938,(int64_t)in_stack_ffffffffffffe930);
        dVar1 = *pdVar6;
        pdVar6 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe940->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe938,(int64_t)in_stack_ffffffffffffe930);
        *pdVar6 = dVar1;
      }
    }
    pzshape::TPZShapePrism::ShapeGenerating
              (in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8,in_stack_ffffffffffffedd0);
    local_558 = 6;
    for (local_55c = 6; local_55c < 0x15; local_55c = local_55c + 1) {
      TPZVec<int>::operator[]((TPZVec<int> *)(local_10 + 0x70),(long)(local_55c + -6));
      local_560 = pzshape::TPZShapePrism::NConnectShapeF
                            ((int)in_stack_ffffffffffffe920,
                             (int)((ulong)in_stack_ffffffffffffe918 >> 0x20));
      if (local_560 != 0) {
        pdVar6 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe940->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe938,(int64_t)in_stack_ffffffffffffe930);
        dVar1 = *pdVar6;
        pdVar6 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe940->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe938,(int64_t)in_stack_ffffffffffffe930);
        *pdVar6 = dVar1;
        for (local_564 = 0; local_564 < 3; local_564 = local_564 + 1) {
          pdVar6 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe940->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe938,(int64_t)in_stack_ffffffffffffe930)
          ;
          dVar1 = *pdVar6;
          pdVar6 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe940->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe938,(int64_t)in_stack_ffffffffffffe930)
          ;
          *pdVar6 = dVar1;
        }
        local_558 = local_558 + 1;
        if (local_560 != 1) {
          local_570 = TPZVec<TPZTransform<double>_>::operator[]
                                ((TPZVec<TPZTransform<double>_> *)(local_10 + 400),
                                 (long)(local_55c + -6));
          local_574 = pztopology::TPZPrism::SideDimension(0x18a24ef);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffe940,(int64_t)in_stack_ffffffffffffe938,
                     (int64_t)in_stack_ffffffffffffe930);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffe940,(int64_t)in_stack_ffffffffffffe938,
                     (int64_t)in_stack_ffffffffffffe930);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffe940,(int64_t)in_stack_ffffffffffffe938,
                     (int64_t)in_stack_ffffffffffffe930);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffe940,(int64_t)in_stack_ffffffffffffe938,
                     (int64_t)in_stack_ffffffffffffe930);
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffe940,
                     (int64_t)in_stack_ffffffffffffe938);
          TPZTransform<double>::Apply
                    (in_stack_ffffffffffffe950,in_stack_ffffffffffffe948,
                     (TPZVec<double> *)in_stack_ffffffffffffe940);
          TPZVec<int>::operator[]((TPZVec<int> *)(local_10 + 0x70),(long)(local_55c + -6));
          pzshape::TPZShapePrism::ShapeInternal
                    ((int)((ulong)in_stack_ffffffffffffe940 >> 0x20),in_stack_ffffffffffffe938,
                     (int)((ulong)in_stack_ffffffffffffe930 >> 0x20),in_stack_ffffffffffffe928,
                     in_stack_ffffffffffffe920);
          if (local_574 < 3) {
            local_1498 = 0x3ff0000000000000;
            local_14a0 = 0;
            local_14a4 = 1;
            TPZFNMatrix<1,_double>::TPZFNMatrix
                      (in_stack_ffffffffffffe960,(int64_t)in_stack_ffffffffffffe958,
                       (int64_t)in_stack_ffffffffffffe950,(double *)in_stack_ffffffffffffe948);
            pTVar7 = TPZTransform<double>::Mult(local_570);
            (*(pTVar7->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x27])(0x3ff0000000000000,0,pTVar7,local_ce8,local_1548,local_10a0,1)
            ;
            for (local_155c = 1; local_155c < local_560; local_155c = local_155c + 1) {
              pdVar6 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe940->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe938,
                                  (int64_t)in_stack_ffffffffffffe930);
              dVar1 = *pdVar6;
              pdVar6 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe940->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe938,
                                  (int64_t)in_stack_ffffffffffffe930);
              dVar2 = *pdVar6;
              pdVar6 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe940->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe938,
                                  (int64_t)in_stack_ffffffffffffe930);
              *pdVar6 = dVar1 * dVar2;
              for (local_1560 = 0; local_1560 < 3; local_1560 = local_1560 + 1) {
                pdVar6 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffe940->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffe938,
                                    (int64_t)in_stack_ffffffffffffe930);
                dVar1 = *pdVar6;
                pdVar6 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffe940->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffe938,
                                    (int64_t)in_stack_ffffffffffffe930);
                dVar2 = *pdVar6;
                pdVar6 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffe940->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffe938,
                                    (int64_t)in_stack_ffffffffffffe930);
                dVar3 = *pdVar6;
                pdVar6 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffe940->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffe938,
                                    (int64_t)in_stack_ffffffffffffe930);
                dVar4 = *pdVar6;
                pdVar6 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffe940->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffe938,
                                    (int64_t)in_stack_ffffffffffffe930);
                *pdVar6 = dVar1 * dVar2 + dVar3 * dVar4;
              }
              local_558 = local_558 + 1;
            }
            TPZFNMatrix<1,_double>::~TPZFNMatrix((TPZFNMatrix<1,_double> *)0x18a2a01);
          }
          else {
            for (local_1564 = 1; local_1564 < local_560; local_1564 = local_1564 + 1) {
              pdVar6 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe940->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe938,
                                  (int64_t)in_stack_ffffffffffffe930);
              dVar1 = *pdVar6;
              pdVar6 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe940->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe938,
                                  (int64_t)in_stack_ffffffffffffe930);
              in_stack_ffffffffffffe960 = (TPZFNMatrix<1,_double> *)(dVar1 * *pdVar6);
              pdVar6 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe940->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe938,
                                  (int64_t)in_stack_ffffffffffffe930);
              *pdVar6 = (double)in_stack_ffffffffffffe960;
              for (local_1568 = 0; local_1568 < 3; local_1568 = local_1568 + 1) {
                in_stack_ffffffffffffe958 =
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe940->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe938,
                                (int64_t)in_stack_ffffffffffffe930);
                in_stack_ffffffffffffe948 = (TPZVec<double> *)*in_stack_ffffffffffffe958;
                in_stack_ffffffffffffe950 =
                     (TPZTransform<double> *)
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe940->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe938,
                                (int64_t)in_stack_ffffffffffffe930);
                in_stack_ffffffffffffe938 =
                     (TPZVec<double> *)
                     (in_stack_ffffffffffffe950->super_TPZSavable)._vptr_TPZSavable;
                in_stack_ffffffffffffe940 =
                     (TPZFNMatrix<100,_double> *)
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe940->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe938,
                                (int64_t)in_stack_ffffffffffffe930);
                in_stack_ffffffffffffe928 =
                     (TPZFMatrix<double> *)
                     (in_stack_ffffffffffffe940->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                     super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
                in_stack_ffffffffffffe930 =
                     TPZFMatrix<double>::operator()
                               ((TPZFMatrix<double> *)in_stack_ffffffffffffe940,
                                (int64_t)in_stack_ffffffffffffe938,
                                (int64_t)in_stack_ffffffffffffe930);
                in_stack_ffffffffffffe918 =
                     (_func_int **)
                     ((double)in_stack_ffffffffffffe948 * (double)in_stack_ffffffffffffe938 +
                     (double)in_stack_ffffffffffffe928 * *in_stack_ffffffffffffe930);
                in_stack_ffffffffffffe920 =
                     (TPZFMatrix<double> *)
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe940->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe938,
                                (int64_t)in_stack_ffffffffffffe930);
                (in_stack_ffffffffffffe920->super_TPZMatrix<double>).super_TPZBaseMatrix.
                super_TPZSavable._vptr_TPZSavable = in_stack_ffffffffffffe918;
              }
              local_558 = local_558 + 1;
            }
          }
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffe920);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x18a2c53);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x18a2c60);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x18a2c6d);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x18a2c7a);
        }
      }
    }
    TPZFNMatrix<63,_double>::~TPZFNMatrix((TPZFNMatrix<63,_double> *)0x18a2ce0);
    TPZFNMatrix<63,_double>::~TPZFNMatrix((TPZFNMatrix<63,_double> *)0x18a2ced);
  }
  return;
}

Assistant:

void TPZShapeH1<TSHAPE>::Shape(const TPZVec<REAL> &pt, TPZShapeData &data) {

    
//    TPZVec<REAL> &pt = par.pt;
//    TPZFMatrix<REAL> &phi = par.phi;
//    TPZFMatrix<REAL> &dphi = par.dphi;
    
    TSHAPE::ShapeCorner(pt,data.fPhi,data.fDPhi);
    
    if(data.fPhi.Rows() == TSHAPE::NCornerNodes) return;
    
    const int dim = TSHAPE::Dimension;
    const int NSides = TSHAPE::NSides;
    const int NCorners = TSHAPE::NCornerNodes;

    TPZFNMatrix<NSides*dim,REAL> phiblend(NSides,1),dphiblend(dim,NSides);
    for(int nod=0; nod<NCorners; nod++)
    {
        phiblend(nod,0) = data.fPhi(nod,0);
        for(int d=0; d< dim; d++)
        {
            dphiblend(d,nod) = data.fDPhi(d,nod);
        }
    }
    TSHAPE::ShapeGenerating(pt, phiblend, dphiblend);
    int shape = NCorners;
    for (int side = NCorners; side<NSides ; side++)
    {
        int numshape = TSHAPE::NConnectShapeF(side, data.fH1ConnectOrders[side-NCorners]);
        if(numshape == 0) continue;
        
        data.fPhi(shape,0) = phiblend(side,0);
        for(int d=0; d<dim; d++) data.fDPhi(d,shape) = dphiblend(d,side);
        shape++;
        
        if(numshape == 1) continue;
        
        TPZTransform<REAL> &transform = data.fSideTransforms[side - NCorners];
        int sidedim = TSHAPE::SideDimension(side);
        TPZFNMatrix<100,REAL> phin(numshape,1), dphin(sidedim,numshape), dphiaux(TSHAPE::Dimension,numshape),
            dphiaux2(TSHAPE::Dimension,numshape);
        TPZManVector<REAL,3> outvec(sidedim);
        transform.Apply(pt, outvec);
//        dphin.Zero();
        TSHAPE::ShapeInternal(side, outvec,data.fH1ConnectOrders[side - NCorners], phin, dphin);
        if(sidedim < 3)
        {
            constexpr REAL alpha = 1.;
            constexpr REAL beta = 0.;
            constexpr int opt = 1;
            TPZFNMatrix<1,REAL> auxmat(1,1,0);    
            TPZFMatrix<REAL> &mult = transform.Mult();
            mult.MultAdd(dphin, auxmat, dphiaux,alpha,beta,opt);
            
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphiaux(xj,i);
                }
                shape++;
            }
        } else
        {
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphin(xj,i);
                }
                shape++;
            }

        }
    }
    
}